

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int encode_with_recode_loop(AV1_COMP *cpi,size_t *size,uint8_t *dest,size_t dest_size)

{
  uint16_t uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  YV12_BUFFER_CONFIG *pYVar5;
  RefCntBuffer *pRVar6;
  size_t in_RCX;
  uint8_t *in_RDX;
  AV1_COMP *in_RSI;
  AV1_COMP *in_RDI;
  int in_stack_0000000c;
  AV1_COMP *in_stack_00000010;
  int in_stack_0000002c;
  int largest_tile_id;
  int do_dummy_pack;
  DuckyEncodeFrameInfo *frame_info;
  int scale_references;
  int do_mv_stats_collection;
  int last_loop_allow_hp;
  int low_cr_seen;
  int undershoot_seen;
  int overshoot_seen;
  int loop_count;
  int loop;
  int q_high;
  int q_low;
  int q;
  int bottom_index;
  int top_index;
  int allow_recode;
  QuantizationCfg *q_cfg;
  AV1EncoderConfig *oxcf;
  GlobalMotionInfo *gm_info;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  int in_stack_0000017c;
  AV1_COMP *in_stack_00000180;
  int in_stack_ffffffffffffff2c;
  AV1_COMP *in_stack_ffffffffffffff30;
  undefined4 uVar7;
  AV1_COMMON *in_stack_ffffffffffffff38;
  AV1_COMP *in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff48;
  uint uVar8;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  aom_bit_depth_t in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  AV1_COMP *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int iVar9;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar10;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar11;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar12;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  uint uVar13;
  uint in_stack_ffffffffffffff84;
  uint uVar14;
  aom_tune_metric tuning;
  aom_tune_metric phase;
  YV12_BUFFER_CONFIG *scaled;
  YV12_BUFFER_CONFIG *unscaled;
  AV1_COMMON *cm_00;
  RATE_CONTROL *largest_tile_id_00;
  AV1_COMP *cpi_00;
  uint32_t local_14;
  
  cpi_00 = (AV1_COMP *)&in_RDI->common;
  largest_tile_id_00 = &in_RDI->rc;
  cm_00 = (AV1_COMMON *)&in_RDI->gm_info;
  unscaled = (YV12_BUFFER_CONFIG *)&in_RDI->oxcf;
  scaled = (YV12_BUFFER_CONFIG *)&(in_RDI->oxcf).q_cfg;
  uVar2 = (uint)((in_RDI->sf).hl_sf.recode_loop != '\0');
  set_size_independent_vars(in_stack_ffffffffffffff40);
  iVar3 = is_stat_consumption_stage_twopass(in_RDI);
  if ((iVar3 != 0) && ((in_RDI->sf).interp_sf.adaptive_interp_filter_search != 0)) {
    uVar1 = av1_setup_interp_filter_search_mask
                      ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    (in_RDI->interp_search_flags).interp_filter_search_mask = uVar1;
  }
  av1_setup_frame_size((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  iVar3 = av1_superres_in_recode_allowed(in_RDI);
  if (((iVar3 == 0) || (in_RDI->superres_mode == AOM_SUPERRES_NONE)) ||
     ((char)(cpi_00->enc_quant_dequant_params).quants.y_quant[4][0] != '\b')) {
    tuning = AOM_TUNE_PSNR;
    iVar3 = 0;
    av1_set_size_dependent_vars
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    phase = tuning;
    av1_set_mv_search_params
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    allocate_gradient_info_for_hog(in_stack_ffffffffffffff40);
    allocate_src_var_of_4x4_sub_block_buf(in_stack_ffffffffffffff40);
    if ((in_RDI->sf).part_sf.partition_search_type == '\x02') {
      variance_partition_alloc(in_stack_ffffffffffffff30);
    }
    if (((CurrentFrame *)&cpi_00->ppi)->frame_type == '\0') {
      copy_frame_prob_info(in_stack_ffffffffffffff30);
    }
    if (((in_RDI->sf).hl_sf.disable_extra_sc_testing == 0) && (in_RDI->use_ducky_encode == 0)) {
      av1_determine_sc_tools_with_encoding(in_stack_00000180,in_stack_0000017c);
    }
    in_RDI->num_frame_recode = 0;
    uVar13 = 0;
    uVar12 = 0;
    uVar11 = 0;
    do {
      uVar14 = 0;
      iVar10 = 1;
      if (((0 < (int)uVar13) && (in_RDI->source != (YV12_BUFFER_CONFIG *)0x0)) &&
         ((((cm_00->current_frame).frame_type & 1) != 0 &&
          (((in_RDI->source->field_2).field_0.y_crop_width !=
            *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 4) ||
           ((in_RDI->source->field_3).field_0.y_crop_height !=
            *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 6))))))) {
        (cm_00->current_frame).frame_type = '\0';
      }
      uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff30 >> 0x20);
      in_stack_ffffffffffffff38 =
           (AV1_COMMON *)
           CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                    (uint)(in_RDI->alloc_pyramid & 1));
      pYVar5 = av1_realloc_and_scale_if_required
                         (cm_00,unscaled,scaled,(InterpFilter)(uVar2 >> 0x18),phase,
                          SUB41((uint)iVar3 >> 0x18,0),SUB41((uint)iVar3 >> 0x10,0),(uint32_t)in_RSI
                          ,SUB41((uint)iVar3 >> 8,0));
      in_RDI->source = pYVar5;
      uVar8 = uVar13;
      if (in_RDI->unscaled_last_source != (YV12_BUFFER_CONFIG *)0x0) {
        in_stack_ffffffffffffff38 =
             (AV1_COMMON *)
             CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                      (uint)(in_RDI->alloc_pyramid & 1));
        pYVar5 = av1_realloc_and_scale_if_required
                           (cm_00,unscaled,scaled,(InterpFilter)(uVar2 >> 0x18),phase,
                            SUB41((uint)iVar3 >> 0x18,0),SUB41((uint)iVar3 >> 0x10,0),
                            (uint32_t)in_RSI,SUB41((uint)iVar3 >> 8,0));
        in_RDI->last_source = pYVar5;
        uVar8 = uVar13;
      }
      iVar9 = 0;
      if (((in_RDI->ppi->gf_group).frame_parallel_level[in_RDI->gf_frame_index] == 0) &&
         (iVar4 = frame_is_intra_only((AV1_COMMON *)cpi_00), iVar4 == 0)) {
        if (0 < (int)uVar8) {
          release_scaled_references
                    ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        }
        av1_scale_references
                  (cpi_00,(InterpFilter)((ulong)largest_tile_id_00 >> 0x38),(int)largest_tile_id_00,
                   (int)((ulong)cm_00 >> 0x20));
      }
      if ((in_RDI->use_ducky_encode != 0) &&
         (in_stack_ffffffffffffff60 = (AV1_COMP *)&in_RDI->ducky_encode_info,
         (((DuckyEncodeInfo *)in_stack_ffffffffffffff60)->frame_info).qp_mode == '\x01')) {
        *(int *)(cpi_00->enc_quant_dequant_params).quants.u_quant_fp[0xf4] =
             (in_RDI->ducky_encode_info).frame_info.delta_q_enabled;
      }
      in_stack_ffffffffffffff30 =
           (AV1_COMP *)CONCAT44(uVar7,*(undefined4 *)((long)&unscaled[4].field_5 + 0x10));
      av1_set_quantizer((AV1_COMMON *)CONCAT44(uVar12,uVar11),iVar10,iVar9,
                        (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                        (int)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                        SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0),tuning);
      av1_set_speed_features_qindex_dependent(in_stack_00000010,in_stack_0000000c);
      av1_init_quantizer((EncQuantDequantParams *)in_stack_ffffffffffffff60,
                         (CommonQuantParams *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      av1_set_variance_partition_thresholds
                ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      if (uVar8 == 0) {
        av1_setup_frame(in_stack_ffffffffffffff40);
      }
      else {
        pRVar6 = get_primary_ref_frame_buf(in_stack_ffffffffffffff38);
        if (pRVar6 == (RefCntBuffer *)0x0) {
          av1_default_coef_probs((AV1_COMMON *)in_stack_ffffffffffffff30);
          av1_setup_frame_contexts((AV1_COMMON *)in_stack_ffffffffffffff40);
        }
      }
      if (*(char *)&scaled->field_2 == '\x01') {
        av1_vaq_frame_setup(in_stack_ffffffffffffff60);
      }
      else if (*(char *)&scaled->field_2 == '\x02') {
        av1_setup_in_frame_q_adj
                  ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
      if ((char)(cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0xa2][4] == '\0') {
        memset((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0xa2] + 4,0,0xac);
      }
      else if (((char)(cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0xa2][5] == '\0') &&
              (*(long *)(cpi_00->enc_quant_dequant_params).quants.y_quant[0xd] != 0)) {
        segfeatures_copy((segmentation *)
                         ((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0xa2] + 4),
                         (segmentation *)
                         (*(long *)(cpi_00->enc_quant_dequant_params).quants.y_quant[0xd] + 0x58));
        *(undefined1 *)((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0xa2] + 4) =
             *(undefined1 *)(*(long *)(cpi_00->enc_quant_dequant_params).quants.y_quant[0xd] + 0x58)
        ;
      }
      else {
        av1_calculate_segdata
                  ((segmentation *)((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0xa2] + 4))
        ;
      }
      segfeatures_copy((segmentation *)
                       (*(long *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0xd] + 4) + 0x58
                       ),(segmentation *)
                         ((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0xa2] + 4));
      *(char *)(*(long *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0xd] + 4) + 0x58) =
           (char)(cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0xa2][4];
      iVar9 = frame_is_intra_only((AV1_COMMON *)cpi_00);
      if (iVar9 == 0) {
        av1_pick_and_set_high_precision_mv(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
        if ((0 < (int)uVar8) &&
           ((*(byte *)((long)(cpi_00->enc_quant_dequant_params).quants.y_quant[0x1d] + 0xd) & 1) !=
            uVar11)) {
          (cm_00->current_frame).frame_type = '\0';
        }
        uVar11 = (uint)(*(byte *)((long)(cpi_00->enc_quant_dequant_params).quants.y_quant[0x1d] +
                                 0xd) & 1);
      }
      av1_encode_frame((AV1_COMP *)CONCAT44(uVar14,uVar8));
      if ((in_RDI->do_frame_data_update & 1U) == 0) {
        iVar10 = 0;
      }
      if (((in_RDI->mv_stats).valid != 0) && (iVar10 != 0)) {
        memset(&in_RDI->mv_stats,0,0x4c);
      }
      if ((((in_RDI->sf).hl_sf.high_precision_mv_usage == '\0') &&
          (iVar9 = av1_frame_allows_smart_mv(in_stack_ffffffffffffff30), iVar9 != 0)) &&
         (iVar10 != 0)) {
        av1_collect_mv_stats((AV1_COMP *)CONCAT44(uVar12,uVar11),iVar10);
      }
      if (((in_RDI->sf).hl_sf.recode_loop == '\0') ||
         (in_stack_ffffffffffffff54 = CONCAT13(1,(int3)in_stack_ffffffffffffff54),
         unscaled->corrupted == 3)) {
        in_stack_ffffffffffffff54 =
             CONCAT13(unscaled->transfer_characteristics != AOM_CICP_TC_RESERVED_0,
                      (int3)in_stack_ffffffffffffff54);
      }
      in_stack_ffffffffffffff5c = in_stack_ffffffffffffff54 >> 0x18;
      if (in_stack_ffffffffffffff5c != 0) {
        av1_finalize_encoded_frame
                  ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        in_stack_ffffffffffffff58 = 0;
        largest_tile_id_00->coefficient_size = 0;
        iVar10 = av1_pack_bitstream(in_RSI,in_RDX,in_RCX,(size_t *)cpi_00,
                                    &largest_tile_id_00->base_frame_target);
        if (iVar10 != 0) {
          return 1;
        }
        largest_tile_id_00->projected_frame_size = (int)in_RSI->ppi << 3;
      }
      uVar13 = uVar8;
      if (uVar2 != 0) {
        in_stack_ffffffffffffff30 = (AV1_COMP *)&stack0xffffffffffffff78;
        in_stack_ffffffffffffff38 = (AV1_COMMON *)&stack0xffffffffffffff7c;
        in_stack_ffffffffffffff40 = (AV1_COMP *)&stack0xffffffffffffff74;
        recode_loop_update_q
                  (_undershoot_seen,_last_loop_allow_hp,_scale_references,(int *)frame_info,
                   _largest_tile_id,in_stack_0000002c,q_high,_q,_top_index,
                   &q_cfg->use_fixed_qp_offsets,(int)oxcf);
        in_stack_ffffffffffffff48 = uVar8;
      }
      if (in_RDI->use_ducky_encode != 0) {
        uVar14 = 0;
      }
      if (uVar14 != 0) {
        uVar13 = uVar13 + 1;
        if (in_RDI->num_frame_recode < 9) {
          in_stack_ffffffffffffff50 = in_RDI->num_frame_recode + 1;
        }
        else {
          in_stack_ffffffffffffff50 = 9;
        }
        in_RDI->num_frame_recode = in_stack_ffffffffffffff50;
      }
    } while (uVar14 != 0);
    local_14 = 0;
  }
  else {
    local_14 = 0xffffffff;
  }
  return local_14;
}

Assistant:

static int encode_with_recode_loop(AV1_COMP *cpi, size_t *size, uint8_t *dest,
                                   size_t dest_size) {
  AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  GlobalMotionInfo *const gm_info = &cpi->gm_info;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const QuantizationCfg *const q_cfg = &oxcf->q_cfg;
  const int allow_recode = (cpi->sf.hl_sf.recode_loop != DISALLOW_RECODE);
  // Must allow recode if minimum compression ratio is set.
  assert(IMPLIES(oxcf->rc_cfg.min_cr > 0, allow_recode));

  set_size_independent_vars(cpi);
  if (is_stat_consumption_stage_twopass(cpi) &&
      cpi->sf.interp_sf.adaptive_interp_filter_search)
    cpi->interp_search_flags.interp_filter_search_mask =
        av1_setup_interp_filter_search_mask(cpi);

  av1_setup_frame_size(cpi);

  if (av1_superres_in_recode_allowed(cpi) &&
      cpi->superres_mode != AOM_SUPERRES_NONE &&
      cm->superres_scale_denominator == SCALE_NUMERATOR) {
    // Superres mode is currently enabled, but the denominator selected will
    // disable superres. So no need to continue, as we will go through another
    // recode loop for full-resolution after this anyway.
    return -1;
  }

  int top_index = 0, bottom_index = 0;
  int q = 0, q_low = 0, q_high = 0;
  av1_set_size_dependent_vars(cpi, &q, &bottom_index, &top_index);
  q_low = bottom_index;
  q_high = top_index;

  av1_set_mv_search_params(cpi);

  allocate_gradient_info_for_hog(cpi);

  allocate_src_var_of_4x4_sub_block_buf(cpi);

  if (cpi->sf.part_sf.partition_search_type == VAR_BASED_PARTITION)
    variance_partition_alloc(cpi);

  if (cm->current_frame.frame_type == KEY_FRAME) copy_frame_prob_info(cpi);

#if CONFIG_COLLECT_COMPONENT_TIMING
  printf("\n Encoding a frame: \n");
#endif

#if !CONFIG_RD_COMMAND
  // Determine whether to use screen content tools using two fast encoding.
  if (!cpi->sf.hl_sf.disable_extra_sc_testing && !cpi->use_ducky_encode)
    av1_determine_sc_tools_with_encoding(cpi, q);
#endif  // !CONFIG_RD_COMMAND

#if CONFIG_TUNE_VMAF
  if (oxcf->tune_cfg.tuning == AOM_TUNE_VMAF_NEG_MAX_GAIN) {
    av1_vmaf_neg_preprocessing(cpi, cpi->unscaled_source);
  }
#endif

#if CONFIG_TUNE_BUTTERAUGLI
  cpi->butteraugli_info.recon_set = false;
  int original_q = 0;
#endif

  cpi->num_frame_recode = 0;

  // Loop variables
  int loop = 0;
  int loop_count = 0;
  int overshoot_seen = 0;
  int undershoot_seen = 0;
  int low_cr_seen = 0;
  int last_loop_allow_hp = 0;

  do {
    loop = 0;
    int do_mv_stats_collection = 1;

    // if frame was scaled calculate global_motion_search again if already
    // done
    if (loop_count > 0 && cpi->source && gm_info->search_done) {
      if (cpi->source->y_crop_width != cm->width ||
          cpi->source->y_crop_height != cm->height) {
        gm_info->search_done = 0;
      }
    }
    cpi->source = av1_realloc_and_scale_if_required(
        cm, cpi->unscaled_source, &cpi->scaled_source, EIGHTTAP_REGULAR, 0,
        false, false, cpi->oxcf.border_in_pixels, cpi->alloc_pyramid);

#if CONFIG_TUNE_BUTTERAUGLI
    if (oxcf->tune_cfg.tuning == AOM_TUNE_BUTTERAUGLI) {
      if (loop_count == 0) {
        original_q = q;
        // TODO(sdeng): different q here does not make big difference. Use a
        // faster pass instead.
        q = 96;
        av1_setup_butteraugli_source(cpi);
      } else {
        q = original_q;
      }
    }
#endif

    if (cpi->unscaled_last_source != NULL) {
      cpi->last_source = av1_realloc_and_scale_if_required(
          cm, cpi->unscaled_last_source, &cpi->scaled_last_source,
          EIGHTTAP_REGULAR, 0, false, false, cpi->oxcf.border_in_pixels,
          cpi->alloc_pyramid);
    }

    int scale_references = 0;
#if CONFIG_FPMT_TEST
    scale_references =
        cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE ? 1 : 0;
#endif  // CONFIG_FPMT_TEST
    if (scale_references ||
        cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] == 0) {
      if (!frame_is_intra_only(cm)) {
        if (loop_count > 0) {
          release_scaled_references(cpi);
        }
        av1_scale_references(cpi, EIGHTTAP_REGULAR, 0, 0);
      }
    }

#if CONFIG_TUNE_VMAF
    if (oxcf->tune_cfg.tuning >= AOM_TUNE_VMAF_WITH_PREPROCESSING &&
        oxcf->tune_cfg.tuning <= AOM_TUNE_VMAF_NEG_MAX_GAIN) {
      cpi->vmaf_info.original_qindex = q;
      q = av1_get_vmaf_base_qindex(cpi, q);
    }
#endif

#if CONFIG_RD_COMMAND
    RD_COMMAND *rd_command = &cpi->rd_command;
    RD_OPTION option = rd_command->option_ls[rd_command->frame_index];
    if (option == RD_OPTION_SET_Q || option == RD_OPTION_SET_Q_RDMULT) {
      q = rd_command->q_index_ls[rd_command->frame_index];
    }
#endif  // CONFIG_RD_COMMAND

#if CONFIG_BITRATE_ACCURACY
#if CONFIG_THREE_PASS
    if (oxcf->pass == AOM_RC_THIRD_PASS && cpi->vbr_rc_info.ready == 1) {
      int frame_coding_idx =
          av1_vbr_rc_frame_coding_idx(&cpi->vbr_rc_info, cpi->gf_frame_index);
      if (frame_coding_idx < cpi->vbr_rc_info.total_frame_count) {
        q = cpi->vbr_rc_info.q_index_list[frame_coding_idx];
      } else {
        // TODO(angiebird): Investigate why sometimes there is an extra frame
        // after the last GOP.
        q = cpi->vbr_rc_info.base_q_index;
      }
    }
#else
    if (cpi->vbr_rc_info.q_index_list_ready) {
      q = cpi->vbr_rc_info.q_index_list[cpi->gf_frame_index];
    }
#endif  // CONFIG_THREE_PASS
#endif  // CONFIG_BITRATE_ACCURACY

#if CONFIG_RATECTRL_LOG && CONFIG_THREE_PASS && CONFIG_BITRATE_ACCURACY
    // TODO(angiebird): Move this into a function.
    if (oxcf->pass == AOM_RC_THIRD_PASS) {
      int frame_coding_idx =
          av1_vbr_rc_frame_coding_idx(&cpi->vbr_rc_info, cpi->gf_frame_index);
      double qstep_ratio = cpi->vbr_rc_info.qstep_ratio_list[frame_coding_idx];
      FRAME_UPDATE_TYPE update_type =
          cpi->vbr_rc_info.update_type_list[frame_coding_idx];
      rc_log_frame_encode_param(&cpi->rc_log, frame_coding_idx, qstep_ratio, q,
                                update_type);
    }
#endif  // CONFIG_RATECTRL_LOG && CONFIG_THREE_PASS && CONFIG_BITRATE_ACCURACY

    if (cpi->use_ducky_encode) {
      const DuckyEncodeFrameInfo *frame_info =
          &cpi->ducky_encode_info.frame_info;
      if (frame_info->qp_mode == DUCKY_ENCODE_FRAME_MODE_QINDEX) {
        q = frame_info->q_index;
        cm->delta_q_info.delta_q_present_flag = frame_info->delta_q_enabled;
      }
    }

    av1_set_quantizer(cm, q_cfg->qm_minlevel, q_cfg->qm_maxlevel, q,
                      q_cfg->enable_chroma_deltaq, q_cfg->enable_hdr_deltaq,
                      oxcf->mode == ALLINTRA, oxcf->tune_cfg.tuning);
    av1_set_speed_features_qindex_dependent(cpi, oxcf->speed);
    av1_init_quantizer(&cpi->enc_quant_dequant_params, &cm->quant_params,
                       cm->seq_params->bit_depth, cpi->oxcf.algo_cfg.sharpness);

    av1_set_variance_partition_thresholds(cpi, q, 0);

    if (loop_count == 0) {
      av1_setup_frame(cpi);
    } else if (get_primary_ref_frame_buf(cm) == NULL) {
      // Base q-index may have changed, so we need to assign proper default coef
      // probs before every iteration.
      av1_default_coef_probs(cm);
      av1_setup_frame_contexts(cm);
    }

    if (q_cfg->aq_mode == VARIANCE_AQ) {
      av1_vaq_frame_setup(cpi);
    } else if (q_cfg->aq_mode == COMPLEXITY_AQ) {
      av1_setup_in_frame_q_adj(cpi);
    }

    if (cm->seg.enabled) {
      if (!cm->seg.update_data && cm->prev_frame) {
        segfeatures_copy(&cm->seg, &cm->prev_frame->seg);
        cm->seg.enabled = cm->prev_frame->seg.enabled;
      } else {
        av1_calculate_segdata(&cm->seg);
      }
    } else {
      memset(&cm->seg, 0, sizeof(cm->seg));
    }
    segfeatures_copy(&cm->cur_frame->seg, &cm->seg);
    cm->cur_frame->seg.enabled = cm->seg.enabled;

#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, av1_encode_frame_time);
#endif
    // Set the motion vector precision based on mv stats from the last coded
    // frame.
    if (!frame_is_intra_only(cm)) {
      av1_pick_and_set_high_precision_mv(cpi, q);

      // If the precision has changed during different iteration of the loop,
      // then we need to reset the global motion vectors
      if (loop_count > 0 &&
          cm->features.allow_high_precision_mv != last_loop_allow_hp) {
        gm_info->search_done = 0;
      }
      last_loop_allow_hp = cm->features.allow_high_precision_mv;
    }

    // transform / motion compensation build reconstruction frame
    av1_encode_frame(cpi);

    // Disable mv_stats collection for parallel frames based on update flag.
    if (!cpi->do_frame_data_update) do_mv_stats_collection = 0;

    // Reset the mv_stats in case we are interrupted by an intraframe or an
    // overlay frame.
    if (cpi->mv_stats.valid && do_mv_stats_collection) av1_zero(cpi->mv_stats);

    // Gather the mv_stats for the next frame
    if (cpi->sf.hl_sf.high_precision_mv_usage == LAST_MV_DATA &&
        av1_frame_allows_smart_mv(cpi) && do_mv_stats_collection) {
      av1_collect_mv_stats(cpi, q);
    }

#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, av1_encode_frame_time);
#endif

#if CONFIG_BITRATE_ACCURACY || CONFIG_RD_COMMAND
    const int do_dummy_pack = 1;
#else   // CONFIG_BITRATE_ACCURACY
    // Dummy pack of the bitstream using up to date stats to get an
    // accurate estimate of output frame size to determine if we need
    // to recode.
    const int do_dummy_pack =
        (cpi->sf.hl_sf.recode_loop >= ALLOW_RECODE_KFARFGF &&
         oxcf->rc_cfg.mode != AOM_Q) ||
        oxcf->rc_cfg.min_cr > 0;
#endif  // CONFIG_BITRATE_ACCURACY
    if (do_dummy_pack) {
      av1_finalize_encoded_frame(cpi);
      int largest_tile_id = 0;  // Output from bitstream: unused here
      rc->coefficient_size = 0;
      if (av1_pack_bitstream(cpi, dest, dest_size, size, &largest_tile_id) !=
          AOM_CODEC_OK) {
        return AOM_CODEC_ERROR;
      }

      // bits used for this frame
      rc->projected_frame_size = (int)(*size) << 3;
#if CONFIG_RD_COMMAND
      PSNR_STATS psnr;
      aom_calc_psnr(cpi->source, &cpi->common.cur_frame->buf, &psnr);
      printf("q %d rdmult %d rate %d dist %" PRIu64 "\n", q, cpi->rd.RDMULT,
             rc->projected_frame_size, psnr.sse[0]);
      ++rd_command->frame_index;
      if (rd_command->frame_index == rd_command->frame_count) {
        return AOM_CODEC_ERROR;
      }
#endif  // CONFIG_RD_COMMAND

#if CONFIG_RATECTRL_LOG && CONFIG_THREE_PASS && CONFIG_BITRATE_ACCURACY
      if (oxcf->pass == AOM_RC_THIRD_PASS) {
        int frame_coding_idx =
            av1_vbr_rc_frame_coding_idx(&cpi->vbr_rc_info, cpi->gf_frame_index);
        rc_log_frame_entropy(&cpi->rc_log, frame_coding_idx,
                             rc->projected_frame_size, rc->coefficient_size);
      }
#endif  // CONFIG_RATECTRL_LOG && CONFIG_THREE_PASS && CONFIG_BITRATE_ACCURACY
    }

#if CONFIG_TUNE_VMAF
    if (oxcf->tune_cfg.tuning >= AOM_TUNE_VMAF_WITH_PREPROCESSING &&
        oxcf->tune_cfg.tuning <= AOM_TUNE_VMAF_NEG_MAX_GAIN) {
      q = cpi->vmaf_info.original_qindex;
    }
#endif
    if (allow_recode) {
      // Update q and decide whether to do a recode loop
      recode_loop_update_q(cpi, &loop, &q, &q_low, &q_high, top_index,
                           bottom_index, &undershoot_seen, &overshoot_seen,
                           &low_cr_seen, loop_count);
    }

#if CONFIG_TUNE_BUTTERAUGLI
    if (loop_count == 0 && oxcf->tune_cfg.tuning == AOM_TUNE_BUTTERAUGLI) {
      loop = 1;
      av1_setup_butteraugli_rdmult_and_restore_source(cpi, 0.4);
    }
#endif

    if (cpi->use_ducky_encode) {
      // Ducky encode currently does not support recode loop.
      loop = 0;
    }
#if CONFIG_BITRATE_ACCURACY || CONFIG_RD_COMMAND
    loop = 0;  // turn off recode loop when CONFIG_BITRATE_ACCURACY is on
#endif         // CONFIG_BITRATE_ACCURACY || CONFIG_RD_COMMAND

    if (loop) {
      ++loop_count;
      cpi->num_frame_recode =
          (cpi->num_frame_recode < (NUM_RECODES_PER_FRAME - 1))
              ? (cpi->num_frame_recode + 1)
              : (NUM_RECODES_PER_FRAME - 1);
#if CONFIG_INTERNAL_STATS
      ++cpi->frame_recode_hits;
#endif
    }
#if CONFIG_COLLECT_COMPONENT_TIMING
    if (loop) printf("\n Recoding:");
#endif
  } while (loop);

  return AOM_CODEC_OK;
}